

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

Matrix * __thiscall
LinearSystem::GetSolutionMatrix(Matrix *__return_storage_ptr__,LinearSystem *this)

{
  Permutation *this_00;
  Matrix *rhs;
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  this_00 = ExtendedMatrix::GetMainColumnPermutation(&this->system_);
  Permutation::GetInverse((Permutation *)&_Stack_28,this_00);
  rhs = ExtendedMatrix::GetExtensionMatrix(&this->system_);
  operator*(__return_storage_ptr__,(Permutation *)&_Stack_28,rhs);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

Matrix LinearSystem::GetSolutionMatrix() const {
  return system_.GetMainColumnPermutation().GetInverse() * system_.GetExtensionMatrix();
}